

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_timer.c
# Opt level: O1

uint32_t cpu_mips_get_random_mips64(CPUMIPSState_conflict5 *env)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = env->tlb->nb_tlb;
  uVar3 = uVar2 - env->CP0_Wired;
  if (uVar3 == 1) {
    uVar2 = uVar2 - 1;
    uVar1 = cpu_mips_get_random_mips64::prev_idx;
  }
  else {
    do {
      cpu_mips_get_random_mips64::seed = cpu_mips_get_random_mips64::seed * 0x41c64e6d + 0x3039;
      uVar2 = (cpu_mips_get_random_mips64::seed >> 0x10) % uVar3 + env->CP0_Wired;
      uVar1 = uVar2;
    } while (uVar2 == cpu_mips_get_random_mips64::prev_idx);
  }
  cpu_mips_get_random_mips64::prev_idx = uVar1;
  return uVar2;
}

Assistant:

uint32_t cpu_mips_get_random(CPUMIPSState *env)
{
    static uint32_t seed = 1;
    static uint32_t prev_idx = 0;
    uint32_t idx;
    uint32_t nb_rand_tlb = env->tlb->nb_tlb - env->CP0_Wired;

    if (nb_rand_tlb == 1) {
        return env->tlb->nb_tlb - 1;
    }

    /* Don't return same value twice, so get another value */
    do {
        /*
         * Use a simple algorithm of Linear Congruential Generator
         * from ISO/IEC 9899 standard.
         */
        seed = 1103515245 * seed + 12345;
        idx = (seed >> 16) % nb_rand_tlb + env->CP0_Wired;
    } while (idx == prev_idx);
    prev_idx = idx;
    return idx;
}